

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

bool __thiscall
ImPlot::
LineSegmentsRenderer<ImPlot::GetterXsYs<unsigned_short>,_ImPlot::GetterXsYRef<unsigned_short>,_ImPlot::TransformerLogLin>
::operator()(LineSegmentsRenderer<ImPlot::GetterXsYs<unsigned_short>,_ImPlot::GetterXsYRef<unsigned_short>,_ImPlot::TransformerLogLin>
             *this,ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  double dVar1;
  ImVec2 IVar2;
  ushort uVar3;
  int iVar4;
  ImU32 IVar5;
  uint uVar6;
  GetterXsYs<unsigned_short> *pGVar7;
  TransformerLogLin *pTVar8;
  ImPlotPlot *pIVar9;
  GetterXsYRef<unsigned_short> *pGVar10;
  ImDrawVert *pIVar11;
  uint *puVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [12];
  ImPlotContext *pIVar15;
  ImPlotContext *pIVar16;
  int iVar17;
  long lVar18;
  float fVar19;
  double dVar20;
  double dVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  
  pIVar15 = GImPlot;
  pGVar7 = this->Getter1;
  pTVar8 = this->Transformer;
  iVar17 = pGVar7->Count;
  lVar18 = (long)(((pGVar7->Offset + prim) % iVar17 + iVar17) % iVar17) * (long)pGVar7->Stride;
  uVar3 = *(ushort *)((long)pGVar7->Ys + lVar18);
  dVar20 = log10((double)*(ushort *)((long)pGVar7->Xs + lVar18) /
                 (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar16 = GImPlot;
  pIVar9 = pIVar15->CurrentPlot;
  dVar1 = (pIVar9->XAxis).Range.Min;
  iVar17 = pTVar8->YAxis;
  pGVar10 = this->Getter2;
  pTVar8 = this->Transformer;
  iVar4 = pGVar10->Count;
  IVar2 = pIVar15->PixelRange[iVar17].Min;
  fVar23 = (float)(pIVar15->My[iVar17] * ((double)uVar3 - pIVar9->YAxis[iVar17].Range.Min) +
                  (double)IVar2.y);
  fVar24 = (float)(pIVar15->Mx *
                   (((double)(float)(dVar20 / pIVar15->LogDenX) *
                     ((pIVar9->XAxis).Range.Max - dVar1) + dVar1) - dVar1) + (double)IVar2.x);
  dVar1 = pGVar10->YRef;
  dVar21 = log10((double)*(ushort *)
                          ((long)pGVar10->Xs +
                          (long)(((prim + pGVar10->Offset) % iVar4 + iVar4) % iVar4) *
                          (long)pGVar10->Stride) / (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar9 = pIVar16->CurrentPlot;
  dVar20 = (pIVar9->XAxis).Range.Min;
  iVar17 = pTVar8->YAxis;
  IVar2 = pIVar16->PixelRange[iVar17].Min;
  fVar19 = (float)(pIVar16->Mx *
                   (((double)(float)(dVar21 / pIVar16->LogDenX) *
                     ((pIVar9->XAxis).Range.Max - dVar20) + dVar20) - dVar20) + (double)IVar2.x);
  fVar22 = (float)(pIVar16->My[iVar17] * (dVar1 - pIVar9->YAxis[iVar17].Range.Min) + (double)IVar2.y
                  );
  auVar28._0_4_ = ~-(uint)(fVar19 <= fVar24) & (uint)fVar19;
  auVar28._4_4_ = ~-(uint)(fVar22 <= fVar23) & (uint)fVar22;
  auVar28._8_4_ = ~-(uint)(fVar24 < fVar19) & (uint)fVar19;
  auVar28._12_4_ = ~-(uint)(fVar23 < fVar22) & (uint)fVar22;
  auVar13._4_4_ = (uint)fVar23 & -(uint)(fVar22 <= fVar23);
  auVar13._0_4_ = (uint)fVar24 & -(uint)(fVar19 <= fVar24);
  auVar13._8_4_ = (uint)fVar24 & -(uint)(fVar24 < fVar19);
  auVar13._12_4_ = (uint)fVar23 & -(uint)(fVar23 < fVar22);
  auVar28 = auVar28 | auVar13;
  fVar25 = (cull_rect->Min).y;
  auVar30._4_4_ = -(uint)(fVar25 < auVar28._4_4_);
  auVar30._0_4_ = -(uint)((cull_rect->Min).x < auVar28._0_4_);
  auVar14._4_8_ = auVar28._8_8_;
  auVar14._0_4_ = -(uint)(auVar28._4_4_ < fVar25);
  auVar29._0_8_ = auVar14._0_8_ << 0x20;
  auVar29._8_4_ = -(uint)(auVar28._8_4_ < (cull_rect->Max).x);
  auVar29._12_4_ = -(uint)(auVar28._12_4_ < (cull_rect->Max).y);
  auVar30._8_8_ = auVar29._8_8_;
  iVar17 = movmskps((int)cull_rect,auVar30);
  if (iVar17 == 0xf) {
    IVar5 = this->Col;
    IVar2 = *uv;
    fVar25 = fVar19 - fVar24;
    fVar26 = fVar22 - fVar23;
    fVar27 = fVar25 * fVar25 + fVar26 * fVar26;
    if (0.0 < fVar27) {
      fVar27 = 1.0 / SQRT(fVar27);
      fVar25 = fVar25 * fVar27;
      fVar26 = fVar26 * fVar27;
    }
    fVar27 = this->Weight * 0.5;
    pIVar11 = DrawList->_VtxWritePtr;
    fVar25 = fVar27 * fVar25;
    fVar27 = fVar27 * fVar26;
    (pIVar11->pos).x = fVar27 + fVar24;
    (pIVar11->pos).y = fVar23 - fVar25;
    (pIVar11->uv).x = IVar2.x;
    (pIVar11->uv).y = IVar2.y;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11->col = IVar5;
    pIVar11[1].pos.x = fVar27 + fVar19;
    pIVar11[1].pos.y = fVar22 - fVar25;
    pIVar11[1].uv = IVar2;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11[1].col = IVar5;
    pIVar11[2].pos.x = fVar19 - fVar27;
    pIVar11[2].pos.y = fVar22 + fVar25;
    pIVar11[2].uv = IVar2;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11[2].col = IVar5;
    pIVar11[3].pos.x = fVar24 - fVar27;
    pIVar11[3].pos.y = fVar25 + fVar23;
    pIVar11[3].uv = IVar2;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11[3].col = IVar5;
    DrawList->_VtxWritePtr = pIVar11 + 4;
    uVar6 = DrawList->_VtxCurrentIdx;
    puVar12 = DrawList->_IdxWritePtr;
    *puVar12 = uVar6;
    puVar12[1] = uVar6 + 1;
    puVar12[2] = DrawList->_VtxCurrentIdx + 2;
    uVar6 = DrawList->_VtxCurrentIdx;
    puVar12[3] = uVar6;
    puVar12[4] = uVar6 + 2;
    puVar12[5] = DrawList->_VtxCurrentIdx + 3;
    DrawList->_IdxWritePtr = puVar12 + 6;
    DrawList->_VtxCurrentIdx = DrawList->_VtxCurrentIdx + 4;
  }
  return (char)iVar17 == '\x0f';
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P1 = Transformer(Getter1(prim));
        ImVec2 P2 = Transformer(Getter2(prim));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2))))
            return false;
        AddLine(P1,P2,Weight,Col,DrawList,uv);
        return true;
    }